

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall
embree::SceneGraph::Transformations::add(Transformations *this,Transformations *other)

{
  ulong uVar1;
  Vector *pVVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_t sVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  
  if ((other->spaces).size_active != 0) {
    uVar29 = 0;
    do {
      pAVar24 = (other->spaces).items;
      pAVar6 = pAVar24 + uVar29;
      fVar7 = (pAVar6->l).vx.field_0.m128[0];
      fVar8 = (pAVar6->l).vx.field_0.m128[1];
      fVar9 = (pAVar6->l).vx.field_0.m128[2];
      fVar10 = (pAVar6->l).vx.field_0.m128[3];
      pVVar2 = &pAVar24[uVar29].l.vy;
      fVar11 = (pVVar2->field_0).m128[0];
      fVar12 = (pVVar2->field_0).m128[1];
      fVar13 = (pVVar2->field_0).m128[2];
      fVar14 = (pVVar2->field_0).m128[3];
      pVVar2 = &pAVar24[uVar29].l.vz;
      fVar15 = (pVVar2->field_0).m128[0];
      fVar16 = (pVVar2->field_0).m128[1];
      fVar17 = (pVVar2->field_0).m128[2];
      fVar18 = (pVVar2->field_0).m128[3];
      pVVar2 = &pAVar24[uVar29].p;
      fVar19 = (pVVar2->field_0).m128[0];
      fVar20 = (pVVar2->field_0).m128[1];
      fVar21 = (pVVar2->field_0).m128[2];
      fVar22 = (pVVar2->field_0).m128[3];
      sVar5 = (this->spaces).size_active;
      uVar26 = (this->spaces).size_alloced;
      uVar1 = sVar5 + 1;
      if (uVar26 < uVar1) {
        uVar28 = uVar1;
        uVar27 = uVar26;
        if (uVar26 != 0) {
          do {
            uVar28 = uVar27 * 2 + (ulong)(uVar27 * 2 == 0);
            uVar27 = uVar28;
          } while (uVar28 < uVar1);
        }
        if (uVar26 != uVar28) {
          pAVar6 = (this->spaces).items;
          pAVar24 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    alignedMalloc(uVar28 << 6,0x10);
          (this->spaces).items = pAVar24;
          if ((this->spaces).size_active != 0) {
            lVar25 = 0x30;
            uVar26 = 0;
            do {
              pAVar24 = (this->spaces).items;
              puVar3 = (undefined8 *)((long)pAVar6 + lVar25 + -0x30);
              uVar23 = puVar3[1];
              puVar4 = (undefined8 *)((long)pAVar24 + lVar25 + -0x30);
              *puVar4 = *puVar3;
              puVar4[1] = uVar23;
              puVar3 = (undefined8 *)((long)pAVar6 + lVar25 + -0x20);
              uVar23 = puVar3[1];
              puVar4 = (undefined8 *)((long)pAVar24 + lVar25 + -0x20);
              *puVar4 = *puVar3;
              puVar4[1] = uVar23;
              puVar3 = (undefined8 *)((long)pAVar6 + lVar25 + -0x10);
              uVar23 = puVar3[1];
              puVar4 = (undefined8 *)((long)pAVar24 + lVar25 + -0x10);
              *puVar4 = *puVar3;
              puVar4[1] = uVar23;
              puVar3 = (undefined8 *)((long)&(pAVar6->l).vx.field_0 + lVar25);
              uVar23 = puVar3[1];
              puVar4 = (undefined8 *)((long)&(pAVar24->l).vx.field_0 + lVar25);
              *puVar4 = *puVar3;
              puVar4[1] = uVar23;
              uVar26 = uVar26 + 1;
              lVar25 = lVar25 + 0x40;
            } while (uVar26 < (this->spaces).size_active);
          }
          alignedFree(pAVar6);
          (this->spaces).size_alloced = uVar28;
        }
      }
      pAVar24 = (this->spaces).items;
      (this->spaces).size_active = uVar1;
      pAVar6 = pAVar24 + sVar5;
      (pAVar6->l).vx.field_0.m128[0] = fVar7;
      (pAVar6->l).vx.field_0.m128[1] = fVar8;
      (pAVar6->l).vx.field_0.m128[2] = fVar9;
      (pAVar6->l).vx.field_0.m128[3] = fVar10;
      pVVar2 = &pAVar24[sVar5].l.vy;
      (pVVar2->field_0).m128[0] = fVar11;
      (pVVar2->field_0).m128[1] = fVar12;
      (pVVar2->field_0).m128[2] = fVar13;
      (pVVar2->field_0).m128[3] = fVar14;
      pVVar2 = &pAVar24[sVar5].l.vz;
      (pVVar2->field_0).m128[0] = fVar15;
      (pVVar2->field_0).m128[1] = fVar16;
      (pVVar2->field_0).m128[2] = fVar17;
      (pVVar2->field_0).m128[3] = fVar18;
      pVVar2 = &pAVar24[sVar5].p;
      (pVVar2->field_0).m128[0] = fVar19;
      (pVVar2->field_0).m128[1] = fVar20;
      (pVVar2->field_0).m128[2] = fVar21;
      (pVVar2->field_0).m128[3] = fVar22;
      uVar29 = uVar29 + 1;
    } while (uVar29 < (other->spaces).size_active);
  }
  return;
}

Assistant:

void add (const Transformations& other) {
        for (size_t i=0; i<other.size(); i++) spaces.push_back(other[i]);
      }